

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_with_opts.c
# Opt level: O1

void parse_with_opts_should_handle_null(void)

{
  cJSON *pcVar1;
  
  pcVar1 = cJSON_ParseWithLengthOpts(anon_var_dwarf_400 + 3,3,(char **)0x0,0);
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail("Failed to handle NULL error pointer.",0x21);
  }
  cJSON_Delete(pcVar1);
  pcVar1 = cJSON_ParseWithLengthOpts("{",2,(char **)0x0,0);
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail("Failed to handle NULL error pointer with parse error.",0x24);
    return;
  }
  return;
}

Assistant:

static void parse_with_opts_should_handle_null(void)
{
    const char *error_pointer = NULL;
    cJSON *item = NULL;
    TEST_ASSERT_NULL_MESSAGE(cJSON_ParseWithOpts(NULL, &error_pointer, false), "Failed to handle NULL input.");
    item = cJSON_ParseWithOpts("{}", NULL, false);
    TEST_ASSERT_NOT_NULL_MESSAGE(item, "Failed to handle NULL error pointer.");
    cJSON_Delete(item);
    TEST_ASSERT_NULL_MESSAGE(cJSON_ParseWithOpts(NULL, NULL, false), "Failed to handle both NULL.");
    TEST_ASSERT_NULL_MESSAGE(cJSON_ParseWithOpts("{", NULL, false), "Failed to handle NULL error pointer with parse error.");
}